

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::setWithCaveats
          (Builder *this,uint index,Reader *reader)

{
  StructBuilder local_38;
  
  capnp::_::ListBuilder::getStructElement(&local_38,&this->builder,index);
  capnp::_::StructBuilder::copyContentFrom(&local_38,reader->_reader);
  return;
}

Assistant:

inline void setWithCaveats(uint index, const typename T::Reader& reader) {
      // Mostly behaves like you'd expect `set` to behave, but with a caveat originating from
      // the fact that structs in a struct list are allocated inline rather than by pointer:
      // If the source struct is larger than the target struct -- say, because the source was built
      // using a newer version of the schema that has additional fields -- it will be truncated,
      // losing data.
      //
      // Note: If you are trying to concatenate some lists, use Orphanage::newOrphanConcat() to
      //   do it without losing any data in case the source lists come from a newer version of the
      //   protocol. (Plus, it's easier to use anyhow.)

      KJ_IREQUIRE(index < size());
      builder.getStructElement(bounded(index) * ELEMENTS).copyContentFrom(reader._reader);
    }